

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5VocabCloseMethod(sqlite3_vtab_cursor *pCursor)

{
  fts5VocabResetCursor((Fts5VocabCursor *)pCursor);
  sqlite3_free(pCursor[0xc].pVtab);
  pCursor[0xc].pVtab = (sqlite3_vtab *)0x0;
  pCursor[0xd].pVtab = (sqlite3_vtab *)0x0;
  sqlite3_finalize((sqlite3_stmt *)pCursor[1].pVtab);
  sqlite3_free(pCursor);
  return 0;
}

Assistant:

static int fts5VocabCloseMethod(sqlite3_vtab_cursor *pCursor){
  Fts5VocabCursor *pCsr = (Fts5VocabCursor*)pCursor;
  fts5VocabResetCursor(pCsr);
  sqlite3Fts5BufferFree(&pCsr->term);
  sqlite3_finalize(pCsr->pStmt);
  sqlite3_free(pCsr);
  return SQLITE_OK;
}